

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O3

void audit_regressor(audit_regressor_data *rd,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  features *pfVar2;
  byte bVar3;
  uint64_t uVar4;
  float *pfVar5;
  pointer pbVar6;
  pointer pcVar7;
  vw *pvVar8;
  float *pfVar9;
  ulong uVar10;
  byte *pbVar11;
  long lVar12;
  
  if (rd->all->lda != 0) {
    audit_regressor_lda(rd,base,ec);
    return;
  }
  rd->cur_class = 0;
  uVar4 = (ec->super_example_predict).ft_offset;
  if (rd->total_class_cnt != 0) {
    do {
      for (pbVar11 = (ec->super_example_predict).indices._begin;
          pbVar11 != (ec->super_example_predict).indices._end; pbVar11 = pbVar11 + 1) {
        bVar3 = *pbVar11;
        pfVar2 = (ec->super_example_predict).feature_space + bVar3;
        pfVar9 = (ec->super_example_predict).feature_space[bVar3].values._begin;
        pfVar5 = (ec->super_example_predict).feature_space[bVar3].values._end;
        if ((ec->super_example_predict).feature_space[bVar3].space_names._end ==
            (ec->super_example_predict).feature_space[bVar3].space_names._begin) {
          if (pfVar5 != pfVar9) {
            uVar10 = 0;
            do {
              audit_regressor_feature
                        (rd,pfVar9[uVar10],
                         (ulong)(uint)(pfVar2->indicies)._begin[uVar10] +
                         (ec->super_example_predict).ft_offset);
              uVar10 = uVar10 + 1;
              pfVar9 = (pfVar2->values)._begin;
            } while (uVar10 < (ulong)((long)(pfVar2->values)._end - (long)pfVar9 >> 2));
          }
        }
        else if (pfVar5 != pfVar9) {
          lVar12 = 0;
          uVar10 = 0;
          do {
            audit_regressor_interaction
                      (rd,*(audit_strings **)
                           ((long)&(((pfVar2->space_names)._begin)->
                                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar12));
            audit_regressor_feature
                      (rd,(pfVar2->values)._begin[uVar10],
                       (ulong)(uint)(pfVar2->indicies)._begin[uVar10] +
                       (ec->super_example_predict).ft_offset);
            pbVar6 = (rd->ns_pre->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            (rd->ns_pre->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar6 + -1;
            pcVar7 = pbVar6[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar7 != &pbVar6[-1].field_2) {
              operator_delete(pcVar7);
            }
            uVar10 = uVar10 + 1;
            lVar12 = lVar12 + 0x10;
          } while (uVar10 < (ulong)((long)(pfVar2->values)._end - (long)(pfVar2->values)._begin >> 2
                                   ));
        }
      }
      pvVar8 = rd->all;
      if ((pvVar8->weights).sparse == false) {
        INTERACTIONS::
        generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_dense_parameters>
                  (&pvVar8->interactions,pvVar8->permutations,&ec->super_example_predict,rd,
                   &(pvVar8->weights).dense_weights);
      }
      else {
        INTERACTIONS::
        generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_sparse_parameters>
                  (&pvVar8->interactions,pvVar8->permutations,&ec->super_example_predict,rd,
                   &(pvVar8->weights).sparse_weights);
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + rd->increment;
      uVar10 = rd->cur_class + 1;
      rd->cur_class = uVar10;
    } while (uVar10 < rd->total_class_cnt);
  }
  (ec->super_example_predict).ft_offset = uVar4;
  return;
}

Assistant:

void audit_regressor(audit_regressor_data& rd, LEARNER::single_learner& base, example& ec)
{
  vw& all = *rd.all;

  if (all.lda > 0)
    audit_regressor_lda(rd, base, ec);
  else
  {
    rd.cur_class = 0;
    uint64_t old_offset = ec.ft_offset;

    while (rd.cur_class < rd.total_class_cnt)
    {
      for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); ++i)
      {
        features& fs = ec.feature_space[(size_t)*i];
        if (fs.space_names.size() > 0)
          for (size_t j = 0; j < fs.size(); ++j)
          {
            audit_regressor_interaction(rd, fs.space_names[j].get());
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
            audit_regressor_interaction(rd, NULL);
          }
        else
          for (size_t j = 0; j < fs.size(); ++j)
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
      }

      if (rd.all->weights.sparse)
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, sparse_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.sparse_weights);
      else
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, dense_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.dense_weights);

      ec.ft_offset += rd.increment;
      ++rd.cur_class;
    }

    ec.ft_offset = old_offset;  // make sure example is not changed.
  }
}